

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O0

void __thiscall bwtil::PartialSums::increment(PartialSums *this,symbol s)

{
  byte bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint i;
  byte in_SIL;
  PartialSums *in_RDI;
  PartialSums *unaff_retaddr;
  uint offset_in_node;
  uint current_node;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar4;
  PartialSums *nodes;
  
  uVar4 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  uVar3 = ((uint)in_RDI->nr_of_nodes - (uint)in_RDI->nr_of_leafs) +
          (int)((ulong)in_SIL / (ulong)(long)(int)(uint)in_RDI->d);
  nodes = in_RDI;
  incrementFrom(unaff_retaddr,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
                CONCAT44(uVar4,uVar3),(uint)((ulong)in_SIL % (ulong)(long)(int)(uint)in_RDI->d));
  while (uVar3 != 0) {
    bVar1 = childNumber(in_RDI,(uint16_t)uVar3);
    i = (uint)bVar1;
    uVar2 = parent(in_RDI,(uint16_t)uVar3);
    uVar3 = (uint)uVar2;
    incrementFrom(unaff_retaddr,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)nodes,
                  CONCAT44(uVar4,uVar3),i);
  }
  return;
}

Assistant:

void increment(symbol s){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): increment() called on empty counter\n";
			exit(0);
		}
	#endif

	#ifdef DEBUG
		if(s>=sigma){
			cout << "ERROR (PartialSums): symbol " << s << " not in alphabet.\n";
			exit(0);
		}
	#endif

		uint current_node = (nr_of_nodes - nr_of_leafs) + (s/d);//offset leafs + leaf number
		uint offset_in_node = s%d;//number of the counter inside the node

		incrementFrom(&nodes, current_node, offset_in_node);//increment counters in the leaf

		while(current_node>0){//repeat while current node is not the root

			offset_in_node = childNumber(current_node);
			current_node = parent(current_node);

			incrementFrom(&nodes, current_node, offset_in_node);

		}

	}